

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_header.c
# Opt level: O3

exr_result_t
extract_attr_32bit(_internal_exr_context *ctxt,_internal_exr_seq_scratch *scratch,void *attrdata,
                  char *aname,char *tname,int32_t attrsz,int32_t num)

{
  exr_result_t eVar1;
  
  if (num * 4 == attrsz) {
    eVar1 = (*scratch->sequential_read)(scratch,attrdata,(ulong)(uint)num << 2);
    if (eVar1 != 0) {
      eVar1 = (*ctxt->print_error)
                        (ctxt,eVar1,"Unable to read \'%s\' %s data",aname,tname,ctxt->print_error);
      return eVar1;
    }
    eVar1 = 0;
  }
  else {
    eVar1 = (*ctxt->print_error)
                      (ctxt,0x11,"Attribute \'%s\': Invalid size %d (exp \'%s\' size 4 * %d (%d))",
                       aname,(ulong)(uint)attrsz,tname,(ulong)(uint)num,(ulong)(uint)(num * 4));
  }
  return eVar1;
}

Assistant:

static exr_result_t
extract_attr_32bit (
    struct _internal_exr_context*     ctxt,
    struct _internal_exr_seq_scratch* scratch,
    void*                             attrdata,
    const char*                       aname,
    const char*                       tname,
    int32_t                           attrsz,
    int32_t                           num)
{
    exr_result_t rv;
    if (attrsz != 4 * num)
        return ctxt->print_error (
            ctxt,
            EXR_ERR_ATTR_SIZE_MISMATCH,
            "Attribute '%s': Invalid size %d (exp '%s' size 4 * %d (%d))",
            aname,
            attrsz,
            tname,
            num,
            4 * num);

    rv = scratch->sequential_read (scratch, attrdata, 4 * (uint64_t) num);
    if (rv != EXR_ERR_SUCCESS)
        return ctxt->print_error (
            ctxt, rv, "Unable to read '%s' %s data", aname, tname);

    priv_to_native32 (attrdata, num);
    return rv;
}